

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,buf_mgr_t *ps_buf_mgr,WORD32 i4_abs_poc)

{
  int in_EDX;
  long *in_RDI;
  UWORD8 u1_del_node;
  dpb_info_t *ps_unmark_node;
  dpb_info_t *ps_next_dpb;
  int i;
  buf_mgr_t *in_stack_ffffffffffffffc8;
  long *local_28;
  long *local_20;
  uint local_18;
  
  local_28 = (long *)*in_RDI;
  local_20 = local_28;
  if (*(int *)(*local_28 + 0x10) != in_EDX) {
    local_18 = 1;
    while (((int)local_18 < (int)(uint)*(byte *)(in_RDI + 0x81) &&
           (*(int *)(*(long *)local_20[1] + 0x10) != in_EDX))) {
      local_20 = (long *)local_20[1];
      local_18 = local_18 + 1;
    }
    if (local_18 == *(byte *)(in_RDI + 0x81)) {
      return;
    }
    local_28 = (long *)local_20[1];
  }
  if (local_28 == (long *)*in_RDI) {
    *in_RDI = local_28[1];
  }
  else {
    local_20[1] = local_28[1];
    local_28[1] = 0;
  }
  *(char *)(in_RDI + 0x81) = (char)in_RDI[0x81] + -1;
  ihevc_buf_mgr_release(in_stack_ffffffffffffffc8,0,0x2d9f58);
  local_28[1] = 0;
  *local_28 = 0;
  return;
}

Assistant:

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,
                           buf_mgr_t *ps_buf_mgr,
                           WORD32 i4_abs_poc)
{
    int i;
    dpb_info_t *ps_next_dpb;

    dpb_info_t *ps_unmark_node;
    UWORD8 u1_del_node;
    UNUSED(u1_del_node);
    u1_del_node = 0;

    /* Find the node with matching absolute POC */
    ps_next_dpb = ps_dpb_mgr->ps_dpb_head;
    if(ps_next_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
    {
        ps_unmark_node = ps_next_dpb;
    }
    else
    {
        for(i = 1; i < ps_dpb_mgr->u1_num_ref_bufs; i++)
        {
            if(ps_next_dpb->ps_prev_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
                break;
            ps_next_dpb = ps_next_dpb->ps_prev_dpb;
        }

        if(i == ps_dpb_mgr->u1_num_ref_bufs)
        {
            return;
        }
        else
            ps_unmark_node = ps_next_dpb->ps_prev_dpb;
    }

    if(ps_unmark_node == ps_dpb_mgr->ps_dpb_head)
    {
        ps_dpb_mgr->ps_dpb_head = ps_unmark_node->ps_prev_dpb;
    }
    else
    {
        ps_next_dpb->ps_prev_dpb = ps_unmark_node->ps_prev_dpb; //update link
        ps_unmark_node->ps_prev_dpb = NULL;
    }
    ps_dpb_mgr->u1_num_ref_bufs--; //decrement buffer count

    /* Release the physical buffer */
    ihevc_buf_mgr_release((buf_mgr_t *)ps_buf_mgr, ps_unmark_node->ps_pic_buf->u1_buf_id,
                          BUF_MGR_REF);
    ps_unmark_node->ps_prev_dpb = NULL;
    ps_unmark_node->ps_pic_buf = NULL;
}